

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysp_node_free(lysf_ctx *ctx,lysp_node *node)

{
  uint16_t uVar1;
  lysp_qname *plVar2;
  lysp_ext_instance *plVar3;
  long lVar4;
  char *pcVar5;
  lysp_node *plVar6;
  lysp_restr *plVar7;
  lysp_when *when;
  long lVar8;
  lysp_ext_instance *plVar9;
  lysp_node *plVar10;
  ly_ctx *ctx_00;
  uint64_t c__;
  ulong uVar11;
  lysp_restr *restr;
  
  plVar7 = lysp_node_musts(node);
  when = lysp_node_when(node);
  lydict_remove(ctx->ctx,node->name);
  lydict_remove(ctx->ctx,node->dsc);
  lydict_remove(ctx->ctx,node->ref);
  lVar8 = 0;
  uVar11 = 0;
  while (plVar2 = node->iffeatures, plVar2 != (lysp_qname *)0x0) {
    if (*(ulong *)&plVar2[-1].flags <= uVar11) {
      free(&plVar2[-1].flags);
      break;
    }
    lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar2->str + lVar8));
    uVar11 = uVar11 + 1;
    lVar8 = lVar8 + 0x18;
  }
  lVar8 = 0;
  plVar9 = (lysp_ext_instance *)0x0;
  while (plVar3 = node->exts, plVar3 != (lysp_ext_instance *)0x0) {
    if (plVar3[-1].exts <= plVar9) {
      free(&plVar3[-1].exts);
      break;
    }
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar3->name + lVar8));
    plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
    lVar8 = lVar8 + 0x70;
  }
  if (when != (lysp_when *)0x0) {
    lysp_when_free(ctx,when);
    free(when);
  }
  if (plVar7 != (lysp_restr *)0x0) {
    restr = plVar7;
    for (plVar9 = (lysp_ext_instance *)0x0; plVar9 < plVar7[-1].exts;
        plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1)) {
      lysp_restr_free(ctx,restr);
      restr = restr + 1;
    }
    free(&plVar7[-1].exts);
  }
  uVar1 = node->nodetype;
  switch(uVar1) {
  case 1:
    lydict_remove(ctx->ctx,(char *)node[1].next);
    lVar8 = 0;
    uVar11 = 0;
    while (pcVar5 = node[1].name, pcVar5 != (char *)0x0) {
      if (*(ulong *)(pcVar5 + -8) <= uVar11) {
        free(pcVar5 + -8);
        break;
      }
      lysp_tpdf_free(ctx,(lysp_tpdf *)(pcVar5 + lVar8));
      uVar11 = uVar11 + 1;
      lVar8 = lVar8 + 0xb0;
    }
    plVar10 = (lysp_node *)node[1].dsc;
    if ((lysp_node *)node[1].dsc != (lysp_node *)0x0) {
      while (plVar10 != (lysp_node *)0x0) {
        plVar6 = plVar10->next;
        lysp_node_free(ctx,plVar10);
        plVar10 = plVar6;
      }
    }
    plVar10 = (lysp_node *)node[1].ref;
    while (plVar10 != (lysp_node *)0x0) {
      plVar6 = plVar10->next;
      lysp_node_free(ctx,plVar10);
      plVar10 = plVar6;
    }
    plVar10 = (lysp_node *)node[1].iffeatures;
    if ((lysp_node *)node[1].iffeatures != (lysp_node *)0x0) {
      while (plVar10 != (lysp_node *)0x0) {
        plVar6 = plVar10->next;
        lysp_node_free(ctx,plVar10);
        plVar10 = plVar6;
      }
    }
    plVar9 = node[1].exts;
    if (node[1].exts != (lysp_ext_instance *)0x0) {
      while (plVar9 != (lysp_ext_instance *)0x0) {
        plVar3 = *(lysp_ext_instance **)&plVar9->format;
        lysp_node_free(ctx,(lysp_node *)plVar9);
        plVar9 = plVar3;
      }
    }
    goto LAB_00158bc7;
  case 2:
    plVar10 = node[1].parent;
    while (plVar10 != (lysp_node *)0x0) {
      plVar6 = plVar10->next;
      lysp_node_free(ctx,plVar10);
      plVar10 = plVar6;
    }
    ctx_00 = ctx->ctx;
    plVar10 = node[1].next;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    goto switchD_0015864c_caseD_3;
  case 4:
    lysp_type_free(ctx,(lysp_type *)&node[1].next);
    lydict_remove(ctx->ctx,(char *)node[2].exts);
    ctx_00 = ctx->ctx;
    plVar10 = node[3].parent;
    break;
  case 8:
    lysp_type_free(ctx,(lysp_type *)&node[1].next);
    lydict_remove(ctx->ctx,(char *)node[2].exts);
    lVar8 = 0;
    plVar9 = (lysp_ext_instance *)0x0;
    while (plVar10 = node[3].parent, plVar10 != (lysp_node *)0x0) {
      if (plVar10[-1].exts <= plVar9) goto LAB_00158ac6;
      lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar10->parent + lVar8));
      plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
      lVar8 = lVar8 + 0x18;
    }
    goto LAB_00158bc7;
  default:
    if (uVar1 == 0x10) {
      lydict_remove(ctx->ctx,(char *)node[1].next);
      lVar8 = 0;
      uVar11 = 0;
      while (pcVar5 = node[1].name, pcVar5 != (char *)0x0) {
        if (*(ulong *)(pcVar5 + -8) <= uVar11) {
          free(pcVar5 + -8);
          break;
        }
        lysp_tpdf_free(ctx,(lysp_tpdf *)(pcVar5 + lVar8));
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 0xb0;
      }
      plVar10 = (lysp_node *)node[1].dsc;
      if ((lysp_node *)node[1].dsc != (lysp_node *)0x0) {
        while (plVar10 != (lysp_node *)0x0) {
          plVar6 = plVar10->next;
          lysp_node_free(ctx,plVar10);
          plVar10 = plVar6;
        }
      }
      plVar10 = (lysp_node *)node[1].ref;
      while (plVar10 != (lysp_node *)0x0) {
        plVar6 = plVar10->next;
        lysp_node_free(ctx,plVar10);
        plVar10 = plVar6;
      }
      plVar10 = (lysp_node *)node[1].iffeatures;
      if ((lysp_node *)node[1].iffeatures != (lysp_node *)0x0) {
        while (plVar10 != (lysp_node *)0x0) {
          plVar6 = plVar10->next;
          lysp_node_free(ctx,plVar10);
          plVar10 = plVar6;
        }
      }
      plVar9 = node[1].exts;
      if (node[1].exts != (lysp_ext_instance *)0x0) {
        while (plVar9 != (lysp_ext_instance *)0x0) {
          plVar3 = *(lysp_ext_instance **)&plVar9->format;
          lysp_node_free(ctx,(lysp_node *)plVar9);
          plVar9 = plVar3;
        }
      }
      lVar8 = 0;
      plVar9 = (lysp_ext_instance *)0x0;
      while (plVar10 = node[2].parent, plVar10 != (lysp_node *)0x0) {
        if (plVar10[-1].exts <= plVar9) goto LAB_00158ac6;
        lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar10->parent + lVar8));
        plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
        lVar8 = lVar8 + 0x18;
      }
      goto LAB_00158bc7;
    }
    if ((uVar1 == 0x20) || (uVar1 == 0x60)) goto LAB_00158bc7;
    if (uVar1 == 0x80) {
      plVar10 = node[1].parent;
      while (plVar10 != (lysp_node *)0x0) {
        plVar6 = plVar10->next;
        lysp_node_free(ctx,plVar10);
        plVar10 = plVar6;
      }
      goto LAB_00158bc7;
    }
    if ((uVar1 == 0x100) || (uVar1 == 0x200)) {
      lVar8 = 0;
      plVar9 = (lysp_ext_instance *)0x0;
      while (plVar10 = node[1].parent, plVar10 != (lysp_node *)0x0) {
        if (plVar10[-1].exts <= plVar9) {
          free(&plVar10[-1].exts);
          break;
        }
        lysp_tpdf_free(ctx,(lysp_tpdf *)((long)&plVar10->parent + lVar8));
        plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
        lVar8 = lVar8 + 0xb0;
      }
      plVar10 = *(lysp_node **)&node[1].nodetype;
      if (*(lysp_node **)&node[1].nodetype != (lysp_node *)0x0) {
        while (plVar10 != (lysp_node *)0x0) {
          plVar6 = plVar10->next;
          lysp_node_free(ctx,plVar10);
          plVar10 = plVar6;
        }
      }
      if (*(short *)&node[1].name != 0) {
        lysp_node_free(ctx,(lysp_node *)&node[1].next);
      }
      if (*(short *)&node[2].exts != 0) {
        lysp_node_free(ctx,(lysp_node *)&node[2].iffeatures);
      }
      goto LAB_00158bc7;
    }
    if (uVar1 == 0x400) {
      lVar8 = 0;
      uVar11 = 0;
      while (lVar4 = *(long *)&node[1].nodetype, lVar4 != 0) {
        if (*(ulong *)(lVar4 + -8) <= uVar11) {
          free((void *)(lVar4 + -8));
          break;
        }
        lysp_tpdf_free(ctx,(lysp_tpdf *)(lVar4 + lVar8));
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 0xb0;
      }
      plVar10 = node[1].next;
      if (node[1].next != (lysp_node *)0x0) {
        while (plVar10 != (lysp_node *)0x0) {
          plVar6 = plVar10->next;
          lysp_node_free(ctx,plVar10);
          plVar10 = plVar6;
        }
      }
      plVar10 = (lysp_node *)node[1].name;
      while (plVar10 != (lysp_node *)0x0) {
        plVar6 = plVar10->next;
        lysp_node_free(ctx,plVar10);
        plVar10 = plVar6;
      }
      goto LAB_00158bc7;
    }
    if (uVar1 == 0x800) {
      lVar8 = 0;
      plVar9 = (lysp_ext_instance *)0x0;
      while (plVar10 = node[1].parent, plVar10 != (lysp_node *)0x0) {
        if (plVar10[-1].exts <= plVar9) {
          free(&plVar10[-1].exts);
          break;
        }
        lysp_refine_free(ctx,(lysp_refine *)((long)&plVar10->parent + lVar8));
        plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
        lVar8 = lVar8 + 0x50;
      }
      plVar10 = *(lysp_node **)&node[1].nodetype;
      if (*(lysp_node **)&node[1].nodetype != (lysp_node *)0x0) {
        while (plVar10 != (lysp_node *)0x0) {
          plVar6 = plVar10->next;
          lysp_node_free(ctx,plVar10);
          plVar10 = plVar6;
        }
      }
      goto LAB_00158bc7;
    }
    if ((uVar1 == 0x1000) || (uVar1 == 0x2000)) {
      lVar8 = 0;
      uVar11 = 0;
      do {
        lVar4 = *(long *)&node[1].nodetype;
        if (lVar4 == 0) {
LAB_001588e0:
          plVar10 = node[1].next;
          if (node[1].next != (lysp_node *)0x0) {
            while (plVar10 != (lysp_node *)0x0) {
              plVar6 = plVar10->next;
              lysp_node_free(ctx,plVar10);
              plVar10 = plVar6;
            }
          }
          plVar10 = (lysp_node *)node[1].name;
          while (plVar10 != (lysp_node *)0x0) {
            plVar6 = plVar10->next;
            lysp_node_free(ctx,plVar10);
            plVar10 = plVar6;
          }
          return;
        }
        if (*(ulong *)(lVar4 + -8) <= uVar11) {
          free((void *)(lVar4 + -8));
          goto LAB_001588e0;
        }
        lysp_tpdf_free(ctx,(lysp_tpdf *)(lVar4 + lVar8));
        uVar11 = uVar11 + 1;
        lVar8 = lVar8 + 0xb0;
      } while( true );
    }
    if (uVar1 == 0x8000) {
      plVar10 = node[1].parent;
      while (plVar10 != (lysp_node *)0x0) {
        plVar6 = plVar10->next;
        lysp_node_free(ctx,plVar10);
        plVar10 = plVar6;
      }
      plVar10 = node[1].next;
      while (plVar10 != (lysp_node *)0x0) {
        plVar6 = plVar10->next;
        lysp_node_free(ctx,plVar10);
        plVar10 = plVar6;
      }
      plVar10 = (lysp_node *)node[1].name;
      while (plVar10 != (lysp_node *)0x0) {
        plVar6 = plVar10->next;
        lysp_node_free(ctx,plVar10);
        plVar10 = plVar6;
      }
      goto LAB_00158bc7;
    }
    if (uVar1 == 0x4000) {
      lVar8 = 0;
      plVar9 = (lysp_ext_instance *)0x0;
      while (plVar10 = node[1].parent, plVar10 != (lysp_node *)0x0) {
        if (plVar10[-1].exts <= plVar9) {
          free(&plVar10[-1].exts);
          break;
        }
        lysp_tpdf_free(ctx,(lysp_tpdf *)((long)&plVar10->parent + lVar8));
        plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
        lVar8 = lVar8 + 0xb0;
      }
      plVar10 = *(lysp_node **)&node[1].nodetype;
      while (plVar10 != (lysp_node *)0x0) {
        plVar6 = plVar10->next;
        lysp_node_free(ctx,plVar10);
        plVar10 = plVar6;
      }
      plVar10 = node[1].next;
      while (plVar10 != (lysp_node *)0x0) {
        plVar6 = plVar10->next;
        lysp_node_free(ctx,plVar10);
        plVar10 = plVar6;
      }
      plVar10 = (lysp_node *)node[1].name;
      while (plVar10 != (lysp_node *)0x0) {
        plVar6 = plVar10->next;
        lysp_node_free(ctx,plVar10);
        plVar10 = plVar6;
      }
      plVar10 = (lysp_node *)node[1].dsc;
      while (plVar10 != (lysp_node *)0x0) {
        plVar6 = plVar10->next;
        lysp_node_free(ctx,plVar10);
        plVar10 = plVar6;
      }
      goto LAB_00158bc7;
    }
    goto switchD_0015864c_caseD_3;
  }
  lydict_remove(ctx_00,(char *)plVar10);
LAB_00158bc7:
  free(node);
  return;
LAB_00158ac6:
  free(&plVar10[-1].exts);
  goto LAB_00158bc7;
switchD_0015864c_caseD_3:
  ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_schema_free.c"
         ,0x25f);
  goto LAB_00158bc7;
}

Assistant:

void
lysp_node_free(struct lysf_ctx *ctx, struct lysp_node *node)
{
    struct lysp_node *child, *next;
    struct lysp_node_container *cont;
    struct lysp_node_leaf *leaf;
    struct lysp_node_leaflist *llist;
    struct lysp_node_list *list;
    struct lysp_node_choice *choice;
    struct lysp_node_case *cas;
    struct lysp_node_uses *uses;
    struct lysp_node_action *act;
    struct lysp_node_action_inout *inout;
    struct lysp_node_notif *notif;
    struct lysp_restr *musts = lysp_node_musts(node);
    struct lysp_when *when = lysp_node_when(node);

    lydict_remove(ctx->ctx, node->name);
    lydict_remove(ctx->ctx, node->dsc);
    lydict_remove(ctx->ctx, node->ref);
    FREE_ARRAY(ctx->ctx, node->iffeatures, lysp_qname_free);
    FREE_ARRAY(ctx, node->exts, lysp_ext_instance_free);

    FREE_MEMBER(ctx, when, lysp_when_free);
    FREE_ARRAY(ctx, musts, lysp_restr_free);

    switch (node->nodetype) {
    case LYS_CONTAINER:
        cont = (struct lysp_node_container *)node;

        lydict_remove(ctx->ctx, cont->presence);
        FREE_ARRAY(ctx, cont->typedefs, lysp_tpdf_free);
        if (cont->groupings) {
            LY_LIST_FOR_SAFE(&cont->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(cont->child, next, child) {
            lysp_node_free(ctx, child);
        }
        if (cont->actions) {
            LY_LIST_FOR_SAFE(&cont->actions->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        if (cont->notifs) {
            LY_LIST_FOR_SAFE(&cont->notifs->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        break;
    case LYS_LEAF:
        leaf = (struct lysp_node_leaf *)node;

        lysp_type_free(ctx, &leaf->type);
        lydict_remove(ctx->ctx, leaf->units);
        lydict_remove(ctx->ctx, leaf->dflt.str);
        break;
    case LYS_LEAFLIST:
        llist = (struct lysp_node_leaflist *)node;

        lysp_type_free(ctx, &llist->type);
        lydict_remove(ctx->ctx, llist->units);
        FREE_ARRAY(ctx->ctx, llist->dflts, lysp_qname_free);
        break;
    case LYS_LIST:
        list = (struct lysp_node_list *)node;

        lydict_remove(ctx->ctx, list->key);
        FREE_ARRAY(ctx, list->typedefs, lysp_tpdf_free);
        if (list->groupings) {
            LY_LIST_FOR_SAFE(&list->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(list->child, next, child) {
            lysp_node_free(ctx, child);
        }
        if (list->actions) {
            LY_LIST_FOR_SAFE(&list->actions->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        if (list->notifs) {
            LY_LIST_FOR_SAFE(&list->notifs->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        FREE_ARRAY(ctx->ctx, list->uniques, lysp_qname_free);
        break;
    case LYS_CHOICE:
        choice = (struct lysp_node_choice *)node;

        LY_LIST_FOR_SAFE(choice->child, next, child) {
            lysp_node_free(ctx, child);
        }
        lydict_remove(ctx->ctx, choice->dflt.str);
        break;
    case LYS_CASE:
        cas = (struct lysp_node_case *)node;

        LY_LIST_FOR_SAFE(cas->child, next, child) {
            lysp_node_free(ctx, child);
        }
        break;
    case LYS_ANYDATA:
    case LYS_ANYXML:
        /* nothing special to do */
        break;
    case LYS_USES:
        uses = (struct lysp_node_uses *)node;

        FREE_ARRAY(ctx, uses->refines, lysp_refine_free);
        if (uses->augments) {
            LY_LIST_FOR_SAFE(&uses->augments->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        break;
    case LYS_RPC:
    case LYS_ACTION:
        act = (struct lysp_node_action *)node;

        FREE_ARRAY(ctx, act->typedefs, lysp_tpdf_free);
        if (act->groupings) {
            LY_LIST_FOR_SAFE(&act->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        if (act->input.nodetype) {
            lysp_node_free(ctx, &act->input.node);
        }
        if (act->output.nodetype) {
            lysp_node_free(ctx, &act->output.node);
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        inout = (struct lysp_node_action_inout *)node;

        FREE_ARRAY(ctx, inout->typedefs, lysp_tpdf_free);
        if (inout->groupings) {
            LY_LIST_FOR_SAFE(&inout->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(inout->child, next, child) {
            lysp_node_free(ctx, child);
        }
        /* do not free the node, it is never standalone but part of the action node */
        return;
    case LYS_NOTIF:
        notif = (struct lysp_node_notif *)node;

        FREE_ARRAY(ctx, notif->typedefs, lysp_tpdf_free);
        if (notif->groupings) {
            LY_LIST_FOR_SAFE(&notif->groupings->node, next, child) {
                lysp_node_free(ctx, child);
            }
        }
        LY_LIST_FOR_SAFE(notif->child, next, child) {
            lysp_node_free(ctx, child);
        }
        break;
    case LYS_GROUPING:
        lysp_grp_free(ctx, (struct lysp_node_grp *)node);
        break;
    case LYS_AUGMENT:
        lysp_augment_free(ctx, ((struct lysp_node_augment *)node));
        break;
    default:
        LOGINT(ctx->ctx);
    }

    free(node);
}